

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

string * __thiscall
kratos::InterfaceVar::to_string_abi_cxx11_(string *__return_storage_ptr__,InterfaceVar *this)

{
  pointer pcVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  size_type *local_88;
  pointer pcStack_80;
  undefined8 local_78;
  size_type *psStack_68;
  string parent_name;
  long local_38 [2];
  
  pcVar1 = (this->interface_->name_)._M_dataplus._M_p;
  psStack_68 = &parent_name._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&psStack_68,pcVar1,pcVar1 + (this->interface_->name_)._M_string_length);
  pcVar1 = (this->super_Var).name._M_dataplus._M_p;
  parent_name.field_2._8_8_ = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&parent_name.field_2 + 8),pcVar1,
             pcVar1 + (this->super_Var).name._M_string_length);
  local_88 = psStack_68;
  pcStack_80 = parent_name._M_dataplus._M_p;
  local_78 = parent_name.field_2._8_8_;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x7;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_88;
  fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)0x24cb6d,format_str,args);
  if ((long *)parent_name.field_2._8_8_ != local_38) {
    operator_delete((void *)parent_name.field_2._8_8_,local_38[0] + 1);
  }
  if (psStack_68 != &parent_name._M_string_length) {
    operator_delete(psStack_68,parent_name._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InterfaceVar::to_string() const {
    std::string parent_name = interface_->name();
    return ::format("{0}.{1}", parent_name, Var::to_string());
}